

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O2

Program __thiscall Lowering::run(Lowering *this,Program *program)

{
  Function *pFVar1;
  pointer ppTVar2;
  Function *this_00;
  Type *return_type;
  mapped_type *ppFVar3;
  Function *extraout_RDX;
  Program *pPVar4;
  pointer ppTVar5;
  Program PVar6;
  Function *function;
  vector<const_Type_*,_std::allocator<const_Type_*>_> argument_types;
  Type *local_98;
  FunctionTable function_table;
  TypeTable type_table;
  
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &type_table._M_t._M_impl.super__Rb_tree_header._M_header;
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  type_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &function_table._M_t._M_impl.super__Rb_tree_header._M_header;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  function_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->type_table = (TypeTable *)0x0;
  pPVar4 = program;
  function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       function_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       type_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pFVar1 = pPVar4->first, pFVar1 != (Function *)0x0) {
    argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ppTVar2 = (pFVar1->argument_types).
              super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    function = pFVar1;
    for (ppTVar5 = (pFVar1->argument_types).
                   super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppTVar5 != ppTVar2; ppTVar5 = ppTVar5 + 1) {
      local_98 = transform_type(&type_table,*ppTVar5);
      std::vector<Type_const*,std::allocator<Type_const*>>::emplace_back<Type_const*>
                ((vector<Type_const*,std::allocator<Type_const*>> *)&argument_types,&local_98);
    }
    this_00 = (Function *)operator_new(0x60);
    return_type = transform_type(&type_table,function->return_type);
    Function::Function(this_00,&argument_types,return_type);
    Program::add_function((Program *)this,this_00);
    ppFVar3 = std::
              map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
              ::operator[](&function_table,&function);
    *ppFVar3 = this_00;
    std::_Vector_base<const_Type_*,_std::allocator<const_Type_*>_>::~_Vector_base
              ((_Vector_base<const_Type_*,_std::allocator<const_Type_*>_> *)&argument_types);
    pPVar4 = (Program *)&pFVar1->next_function;
  }
  while (pFVar1 = program->first, pFVar1 != (Function *)0x0) {
    argument_types.super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pFVar1;
    ppFVar3 = std::
              map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
              ::operator[](&function_table,(key_type *)&argument_types);
    evaluate(&type_table,&function_table,&(*ppFVar3)->block,
             (Block *)(argument_types.
                       super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    program = (Program *)&pFVar1->next_function;
  }
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~_Rb_tree(&function_table._M_t);
  std::
  _Rb_tree<const_Type_*,_std::pair<const_Type_*const,_const_Type_*>,_std::_Select1st<std::pair<const_Type_*const,_const_Type_*>_>,_std::less<const_Type_*>,_std::allocator<std::pair<const_Type_*const,_const_Type_*>_>_>
  ::~_Rb_tree(&type_table._M_t);
  PVar6.last = extraout_RDX;
  PVar6.first = (Function *)this;
  return PVar6;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		TypeTable type_table;
		FunctionTable function_table;
		for (const Function* function: program) {
			std::vector<const Type*> argument_types;
			for (const Type* type: function->get_argument_types()) {
				argument_types.push_back(transform_type(type_table, type));
			}
			Function* new_function = new Function(argument_types, transform_type(type_table, function->get_return_type()));
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			Function* new_function = function_table[function];
			evaluate(type_table, function_table, new_function->get_block(), function->get_block());
		}
		return new_program;
	}